

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

bool axl::io::isSockAddrMatch_ip6(sockaddr_in6 *addr,sockaddr_in6 *filterAddr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  long in_RSI;
  long in_RDI;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  byte bVar28;
  in6_addr addrAny;
  bool local_22;
  bool local_21;
  char local_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char cStack_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_20,0,0x10);
  if ((*(short *)(local_10 + 2) == 0) ||
     (local_21 = false, *(short *)(local_8 + 2) == *(short *)(local_10 + 2))) {
    cVar13 = -(*(char *)(local_10 + 8) == local_20);
    cVar14 = -(*(char *)(local_10 + 9) == cStack_1f);
    cVar15 = -(*(char *)(local_10 + 10) == cStack_1e);
    cVar16 = -(*(char *)(local_10 + 0xb) == cStack_1d);
    cVar17 = -(*(char *)(local_10 + 0xc) == cStack_1c);
    cVar18 = -(*(char *)(local_10 + 0xd) == cStack_1b);
    cVar19 = -(*(char *)(local_10 + 0xe) == cStack_1a);
    cVar20 = -(*(char *)(local_10 + 0xf) == cStack_19);
    cVar21 = -(*(char *)(local_10 + 0x10) == cStack_18);
    cVar22 = -(*(char *)(local_10 + 0x11) == cStack_17);
    cVar23 = -(*(char *)(local_10 + 0x12) == cStack_16);
    cVar24 = -(*(char *)(local_10 + 0x13) == cStack_15);
    cVar25 = -(*(char *)(local_10 + 0x14) == cStack_14);
    cVar26 = -(*(char *)(local_10 + 0x15) == cStack_13);
    cVar27 = -(*(char *)(local_10 + 0x16) == cStack_12);
    bVar28 = -(*(char *)(local_10 + 0x17) == cStack_11);
    auVar1[1] = cVar14;
    auVar1[0] = cVar13;
    auVar1[2] = cVar15;
    auVar1[3] = cVar16;
    auVar1[4] = cVar17;
    auVar1[5] = cVar18;
    auVar1[6] = cVar19;
    auVar1[7] = cVar20;
    auVar1[8] = cVar21;
    auVar1[9] = cVar22;
    auVar1[10] = cVar23;
    auVar1[0xb] = cVar24;
    auVar1[0xc] = cVar25;
    auVar1[0xd] = cVar26;
    auVar1[0xe] = cVar27;
    auVar1[0xf] = bVar28;
    auVar2[1] = cVar14;
    auVar2[0] = cVar13;
    auVar2[2] = cVar15;
    auVar2[3] = cVar16;
    auVar2[4] = cVar17;
    auVar2[5] = cVar18;
    auVar2[6] = cVar19;
    auVar2[7] = cVar20;
    auVar2[8] = cVar21;
    auVar2[9] = cVar22;
    auVar2[10] = cVar23;
    auVar2[0xb] = cVar24;
    auVar2[0xc] = cVar25;
    auVar2[0xd] = cVar26;
    auVar2[0xe] = cVar27;
    auVar2[0xf] = bVar28;
    auVar11[1] = cVar16;
    auVar11[0] = cVar15;
    auVar11[2] = cVar17;
    auVar11[3] = cVar18;
    auVar11[4] = cVar19;
    auVar11[5] = cVar20;
    auVar11[6] = cVar21;
    auVar11[7] = cVar22;
    auVar11[8] = cVar23;
    auVar11[9] = cVar24;
    auVar11[10] = cVar25;
    auVar11[0xb] = cVar26;
    auVar11[0xc] = cVar27;
    auVar11[0xd] = bVar28;
    auVar9[1] = cVar17;
    auVar9[0] = cVar16;
    auVar9[2] = cVar18;
    auVar9[3] = cVar19;
    auVar9[4] = cVar20;
    auVar9[5] = cVar21;
    auVar9[6] = cVar22;
    auVar9[7] = cVar23;
    auVar9[8] = cVar24;
    auVar9[9] = cVar25;
    auVar9[10] = cVar26;
    auVar9[0xb] = cVar27;
    auVar9[0xc] = bVar28;
    auVar7[1] = cVar18;
    auVar7[0] = cVar17;
    auVar7[2] = cVar19;
    auVar7[3] = cVar20;
    auVar7[4] = cVar21;
    auVar7[5] = cVar22;
    auVar7[6] = cVar23;
    auVar7[7] = cVar24;
    auVar7[8] = cVar25;
    auVar7[9] = cVar26;
    auVar7[10] = cVar27;
    auVar7[0xb] = bVar28;
    auVar5[1] = cVar19;
    auVar5[0] = cVar18;
    auVar5[2] = cVar20;
    auVar5[3] = cVar21;
    auVar5[4] = cVar22;
    auVar5[5] = cVar23;
    auVar5[6] = cVar24;
    auVar5[7] = cVar25;
    auVar5[8] = cVar26;
    auVar5[9] = cVar27;
    auVar5[10] = bVar28;
    local_22 = true;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                 (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3 | (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4
                 | (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(cVar25,
                                                  CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar19))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(cVar25,
                                                  CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(cVar22,
                                                  CONCAT11(cVar21,cVar20)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar28 >> 7) << 0xf) != 0xffff) {
      cVar13 = -(*(char *)(local_8 + 8) == *(char *)(local_10 + 8));
      cVar14 = -(*(char *)(local_8 + 9) == *(char *)(local_10 + 9));
      cVar15 = -(*(char *)(local_8 + 10) == *(char *)(local_10 + 10));
      cVar16 = -(*(char *)(local_8 + 0xb) == *(char *)(local_10 + 0xb));
      cVar17 = -(*(char *)(local_8 + 0xc) == *(char *)(local_10 + 0xc));
      cVar18 = -(*(char *)(local_8 + 0xd) == *(char *)(local_10 + 0xd));
      cVar19 = -(*(char *)(local_8 + 0xe) == *(char *)(local_10 + 0xe));
      cVar20 = -(*(char *)(local_8 + 0xf) == *(char *)(local_10 + 0xf));
      cVar21 = -(*(char *)(local_8 + 0x10) == *(char *)(local_10 + 0x10));
      cVar22 = -(*(char *)(local_8 + 0x11) == *(char *)(local_10 + 0x11));
      cVar23 = -(*(char *)(local_8 + 0x12) == *(char *)(local_10 + 0x12));
      cVar24 = -(*(char *)(local_8 + 0x13) == *(char *)(local_10 + 0x13));
      cVar25 = -(*(char *)(local_8 + 0x14) == *(char *)(local_10 + 0x14));
      cVar26 = -(*(char *)(local_8 + 0x15) == *(char *)(local_10 + 0x15));
      cVar27 = -(*(char *)(local_8 + 0x16) == *(char *)(local_10 + 0x16));
      bVar28 = -(*(char *)(local_8 + 0x17) == *(char *)(local_10 + 0x17));
      auVar3[1] = cVar14;
      auVar3[0] = cVar13;
      auVar3[2] = cVar15;
      auVar3[3] = cVar16;
      auVar3[4] = cVar17;
      auVar3[5] = cVar18;
      auVar3[6] = cVar19;
      auVar3[7] = cVar20;
      auVar3[8] = cVar21;
      auVar3[9] = cVar22;
      auVar3[10] = cVar23;
      auVar3[0xb] = cVar24;
      auVar3[0xc] = cVar25;
      auVar3[0xd] = cVar26;
      auVar3[0xe] = cVar27;
      auVar3[0xf] = bVar28;
      auVar4[1] = cVar14;
      auVar4[0] = cVar13;
      auVar4[2] = cVar15;
      auVar4[3] = cVar16;
      auVar4[4] = cVar17;
      auVar4[5] = cVar18;
      auVar4[6] = cVar19;
      auVar4[7] = cVar20;
      auVar4[8] = cVar21;
      auVar4[9] = cVar22;
      auVar4[10] = cVar23;
      auVar4[0xb] = cVar24;
      auVar4[0xc] = cVar25;
      auVar4[0xd] = cVar26;
      auVar4[0xe] = cVar27;
      auVar4[0xf] = bVar28;
      auVar12[1] = cVar16;
      auVar12[0] = cVar15;
      auVar12[2] = cVar17;
      auVar12[3] = cVar18;
      auVar12[4] = cVar19;
      auVar12[5] = cVar20;
      auVar12[6] = cVar21;
      auVar12[7] = cVar22;
      auVar12[8] = cVar23;
      auVar12[9] = cVar24;
      auVar12[10] = cVar25;
      auVar12[0xb] = cVar26;
      auVar12[0xc] = cVar27;
      auVar12[0xd] = bVar28;
      auVar10[1] = cVar17;
      auVar10[0] = cVar16;
      auVar10[2] = cVar18;
      auVar10[3] = cVar19;
      auVar10[4] = cVar20;
      auVar10[5] = cVar21;
      auVar10[6] = cVar22;
      auVar10[7] = cVar23;
      auVar10[8] = cVar24;
      auVar10[9] = cVar25;
      auVar10[10] = cVar26;
      auVar10[0xb] = cVar27;
      auVar10[0xc] = bVar28;
      auVar8[1] = cVar18;
      auVar8[0] = cVar17;
      auVar8[2] = cVar19;
      auVar8[3] = cVar20;
      auVar8[4] = cVar21;
      auVar8[5] = cVar22;
      auVar8[6] = cVar23;
      auVar8[7] = cVar24;
      auVar8[8] = cVar25;
      auVar8[9] = cVar26;
      auVar8[10] = cVar27;
      auVar8[0xb] = bVar28;
      auVar6[1] = cVar19;
      auVar6[0] = cVar18;
      auVar6[2] = cVar20;
      auVar6[3] = cVar21;
      auVar6[4] = cVar22;
      auVar6[5] = cVar23;
      auVar6[6] = cVar24;
      auVar6[7] = cVar25;
      auVar6[8] = cVar26;
      auVar6[9] = cVar27;
      auVar6[10] = bVar28;
      local_22 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(bVar28,CONCAT18(cVar27,CONCAT17(cVar26,CONCAT16(
                                                  cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(
                                                  cVar22,CONCAT12(cVar21,CONCAT11(cVar20,cVar19)))))
                                                  )))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(bVar28,CONCAT17(cVar27,CONCAT16(cVar26,CONCAT15(
                                                  cVar25,CONCAT14(cVar24,CONCAT13(cVar23,CONCAT12(
                                                  cVar22,CONCAT11(cVar21,cVar20)))))))) >> 7) & 1)
                          << 7 | (ushort)(bVar28 >> 7) << 0xf) == 0xffff;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool
isSockAddrMatch_ip6(
	const sockaddr_in6* addr,
	const sockaddr_in6* filterAddr
) {
	in6_addr addrAny = { 0 };

	return
		(!filterAddr->sin6_port || addr->sin6_port == filterAddr->sin6_port) &&
		(memcmp(&filterAddr->sin6_addr, &addrAny, sizeof(addrAny)) == 0 ||
		memcmp(&addr->sin6_addr, &filterAddr->sin6_addr, sizeof(addr->sin6_addr)) == 0);
}